

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int z_deflate(z_streamp strm,int flush)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  deflate_state *s;
  z_Bytef *pzVar4;
  z_Bytef *pzVar5;
  z_Bytef *pzVar6;
  Posf *__s;
  bool bVar7;
  z_Bytef zVar8;
  z_uLong zVar9;
  uint uVar10;
  block_state bVar11;
  gz_headerp pgVar12;
  int iVar13;
  z_uInt zVar14;
  uint uVar15;
  ulong uVar16;
  z_uInt zVar17;
  
  if (strm == (z_streamp)0x0) {
    return -2;
  }
  s = strm->state;
  if (4 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (z_Bytef *)0x0) ||
     (((strm->next_in == (z_Bytef *)0x0 && (strm->avail_in != 0)) ||
      (iVar13 = s->status, flush != 4 && iVar13 == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) goto LAB_00688a64;
  s->strm = strm;
  iVar1 = s->last_flush;
  s->last_flush = flush;
  if (iVar13 == 0x2a) {
    if (s->wrap != 2) {
      uVar10 = s->w_bits * 0x1000 - 0x7800;
      uVar15 = 0;
      if ((s->strategy < 2) && (uVar3 = s->level, uVar15 = 0, 1 < (int)uVar3)) {
        if (uVar3 < 6) {
          uVar15 = 0x40;
        }
        else {
          uVar15 = (uVar3 != 6 | 2) << 6;
        }
      }
      uVar3 = uVar15 + 0x20 + uVar10;
      if (s->strstart == 0) {
        uVar3 = uVar15 | uVar10;
      }
      s->status = 0x71;
      putShortMSB(s,(uVar3 | uVar3 % 0x1f) ^ 0x1f);
      if (s->strstart != 0) {
        putShortMSB(s,(uint)*(ushort *)((long)&strm->adler + 2));
        putShortMSB(s,(uint)(ushort)strm->adler);
      }
      zVar9 = z_adler32(0,(z_Bytef *)0x0,0);
      strm->adler = zVar9;
      iVar13 = s->status;
      goto LAB_00688770;
    }
    zVar9 = z_crc32(0,(uchar *)0x0,0);
    strm->adler = zVar9;
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\x1f';
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = 0x8b;
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\b';
    pgVar12 = s->gzhead;
    if (pgVar12 != (gz_headerp)0x0) {
      iVar13 = pgVar12->text;
      iVar2 = pgVar12->hcrc;
      pzVar4 = pgVar12->extra;
      pzVar5 = pgVar12->name;
      pzVar6 = pgVar12->comment;
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] =
           (pzVar6 != (z_Bytef *)0x0) << 4 |
           (pzVar5 != (z_Bytef *)0x0) << 3 |
           (pzVar4 != (z_Bytef *)0x0) << 2 | (iVar2 != 0) * '\x02' | iVar13 != 0;
      zVar9 = s->gzhead->time;
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = (z_Bytef)zVar9;
      zVar8 = *(z_Bytef *)((long)&s->gzhead->time + 1);
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = zVar8;
      zVar8 = *(z_Bytef *)((long)&s->gzhead->time + 2);
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = zVar8;
      zVar8 = *(z_Bytef *)((long)&s->gzhead->time + 3);
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = zVar8;
      zVar8 = '\x02';
      if (s->level != 9) {
        zVar8 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = zVar8;
      iVar13 = s->gzhead->os;
      uVar15 = s->pending;
      s->pending = uVar15 + 1;
      s->pending_buf[uVar15] = (z_Bytef)iVar13;
      pgVar12 = s->gzhead;
      if (pgVar12->extra != (z_Bytef *)0x0) {
        zVar14 = pgVar12->extra_len;
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = (z_Bytef)zVar14;
        zVar8 = *(z_Bytef *)((long)&s->gzhead->extra_len + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = zVar8;
        pgVar12 = s->gzhead;
      }
      if (pgVar12->hcrc != 0) {
        zVar9 = z_crc32(strm->adler,s->pending_buf,s->pending);
        strm->adler = zVar9;
      }
      s->gzindex = 0;
      s->status = 0x45;
      goto LAB_00688779;
    }
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\0';
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\0';
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\0';
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\0';
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\0';
    zVar8 = '\x02';
    if (s->level != 9) {
      zVar8 = (s->level < 2 || 1 < s->strategy) << 2;
    }
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = zVar8;
    uVar15 = s->pending;
    s->pending = uVar15 + 1;
    s->pending_buf[uVar15] = '\x03';
LAB_00688a1f:
    s->status = 0x71;
  }
  else {
LAB_00688770:
    if (iVar13 == 0x45) {
LAB_00688779:
      pgVar12 = s->gzhead;
      if (pgVar12->extra != (z_Bytef *)0x0) {
        zVar14 = s->pending;
        zVar17 = s->gzindex;
        while (zVar17 < (ushort)pgVar12->extra_len) {
          uVar15 = s->pending;
          if (uVar15 == s->pending_buf_size) {
            if ((pgVar12->hcrc != 0) && (zVar14 <= uVar15 && uVar15 - zVar14 != 0)) {
              zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15 - zVar14);
              strm->adler = zVar9;
            }
            flush_pending(strm);
            zVar14 = s->pending;
            pgVar12 = s->gzhead;
            if (zVar14 == s->pending_buf_size) break;
            zVar17 = s->gzindex;
            uVar15 = zVar14;
          }
          zVar8 = pgVar12->extra[zVar17];
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar17 = s->gzindex + 1;
          s->gzindex = zVar17;
          pgVar12 = s->gzhead;
        }
        if ((pgVar12->hcrc != 0) &&
           (uVar15 = s->pending - zVar14, zVar14 <= s->pending && uVar15 != 0)) {
          zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15);
          strm->adler = zVar9;
          pgVar12 = s->gzhead;
        }
        if (s->gzindex != pgVar12->extra_len) {
          iVar13 = s->status;
          goto LAB_00688838;
        }
        s->gzindex = 0;
      }
      s->status = 0x49;
LAB_00688845:
      if (pgVar12->name != (z_Bytef *)0x0) {
        zVar14 = s->pending;
        do {
          uVar15 = s->pending;
          pgVar12 = s->gzhead;
          if (uVar15 == s->pending_buf_size) {
            if ((pgVar12->hcrc != 0) && (zVar14 <= uVar15 && uVar15 - zVar14 != 0)) {
              zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15 - zVar14);
              strm->adler = zVar9;
            }
            flush_pending(strm);
            zVar14 = s->pending;
            if (zVar14 == s->pending_buf_size) {
              bVar7 = false;
              goto LAB_006888bf;
            }
            pgVar12 = s->gzhead;
            uVar15 = zVar14;
          }
          pzVar4 = pgVar12->name;
          uVar10 = s->gzindex;
          s->gzindex = uVar10 + 1;
          zVar8 = pzVar4[uVar10];
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
        } while (zVar8 != '\0');
        bVar7 = true;
LAB_006888bf:
        if ((s->gzhead->hcrc != 0) &&
           (uVar15 = s->pending - zVar14, zVar14 <= s->pending && uVar15 != 0)) {
          zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15);
          strm->adler = zVar9;
        }
        if (!bVar7) {
          iVar13 = s->status;
          goto LAB_006888fa;
        }
        s->gzindex = 0;
      }
      s->status = 0x5b;
LAB_00688903:
      if (s->gzhead->comment != (z_Bytef *)0x0) {
        zVar14 = s->pending;
        do {
          uVar15 = s->pending;
          pgVar12 = s->gzhead;
          if (uVar15 == s->pending_buf_size) {
            if ((pgVar12->hcrc != 0) && (zVar14 <= uVar15 && uVar15 - zVar14 != 0)) {
              zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15 - zVar14);
              strm->adler = zVar9;
            }
            flush_pending(strm);
            zVar14 = s->pending;
            if (zVar14 == s->pending_buf_size) {
              bVar7 = false;
              goto LAB_00688981;
            }
            pgVar12 = s->gzhead;
            uVar15 = zVar14;
          }
          pzVar4 = pgVar12->comment;
          uVar10 = s->gzindex;
          s->gzindex = uVar10 + 1;
          zVar8 = pzVar4[uVar10];
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
        } while (zVar8 != '\0');
        bVar7 = true;
LAB_00688981:
        if ((s->gzhead->hcrc != 0) &&
           (uVar15 = s->pending - zVar14, zVar14 <= s->pending && uVar15 != 0)) {
          zVar9 = z_crc32(strm->adler,s->pending_buf + zVar14,uVar15);
          strm->adler = zVar9;
        }
        if (!bVar7) {
          iVar13 = s->status;
          goto LAB_006889b8;
        }
      }
      s->status = 0x67;
LAB_006889bd:
      if (s->gzhead->hcrc != 0) {
        uVar10 = s->pending_buf_size;
        zVar14 = s->pending;
        uVar15 = zVar14 + 2;
        if (uVar10 < uVar15) {
          flush_pending(strm);
          uVar10 = s->pending_buf_size;
          zVar14 = s->pending;
          uVar15 = zVar14 + 2;
        }
        if (uVar10 < uVar15) goto LAB_00688a26;
        zVar9 = strm->adler;
        s->pending = zVar14 + 1;
        s->pending_buf[zVar14] = (z_Bytef)zVar9;
        zVar8 = *(z_Bytef *)((long)&strm->adler + 1);
        uVar15 = s->pending;
        s->pending = uVar15 + 1;
        s->pending_buf[uVar15] = zVar8;
        zVar9 = z_crc32(0,(uchar *)0x0,0);
        strm->adler = zVar9;
      }
      goto LAB_00688a1f;
    }
LAB_00688838:
    if (iVar13 == 0x49) {
      pgVar12 = s->gzhead;
      goto LAB_00688845;
    }
LAB_006888fa:
    if (iVar13 == 0x5b) goto LAB_00688903;
LAB_006889b8:
    if (iVar13 == 0x67) goto LAB_006889bd;
  }
LAB_00688a26:
  if (s->pending == 0) {
    if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar1)) goto LAB_00688a64;
LAB_00688a3f:
    if (s->status == 0x29a) {
      if (strm->avail_in != 0) {
LAB_00688a64:
        strm->msg = "buffer error";
        return -5;
      }
LAB_00688a7f:
      if (s->lookahead != 0) goto LAB_00688a88;
      if (flush == 0) {
        return 0;
      }
      if (s->status != 0x29a) goto LAB_00688a88;
    }
    else {
      if (strm->avail_in == 0) goto LAB_00688a7f;
LAB_00688a88:
      bVar11 = (*configuration_table[s->level].func)(s,flush);
      if ((bVar11 & ~block_done) == finish_started) {
        s->status = 0x29a;
      }
      if ((bVar11 & ~finish_started) == need_more) {
        if (strm->avail_out == 0) {
          s->last_flush = -1;
          return 0;
        }
        return 0;
      }
      if (bVar11 == block_done) {
        if (flush == 1) {
          _tr_align(s);
        }
        else {
          _tr_stored_block(s,(z_charf *)0x0,0,0);
          if (flush == 3) {
            __s = s->head;
            uVar16 = (ulong)(s->hash_size - 1);
            __s[uVar16] = 0;
            memset(__s,0,uVar16 * 2);
          }
        }
        flush_pending(strm);
        if (strm->avail_out == 0) goto LAB_00688bf1;
      }
    }
    if (flush == 4) {
      if (0 < s->wrap) {
        uVar15 = strm->adler;
        if (s->wrap == 2) {
          uVar10 = s->pending;
          s->pending = uVar10 + 1;
          s->pending_buf[uVar10] = (z_Bytef)uVar15;
          zVar8 = *(z_Bytef *)((long)&strm->adler + 1);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar8 = *(z_Bytef *)((long)&strm->adler + 2);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar8 = *(z_Bytef *)((long)&strm->adler + 3);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar9 = strm->total_in;
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = (z_Bytef)zVar9;
          zVar8 = *(z_Bytef *)((long)&strm->total_in + 1);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar8 = *(z_Bytef *)((long)&strm->total_in + 2);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
          zVar8 = *(z_Bytef *)((long)&strm->total_in + 3);
          uVar15 = s->pending;
          s->pending = uVar15 + 1;
          s->pending_buf[uVar15] = zVar8;
        }
        else {
          putShortMSB(s,uVar15 >> 0x10);
          putShortMSB(s,(uint)(ushort)strm->adler);
        }
        flush_pending(strm);
        if (0 < s->wrap) {
          s->wrap = -s->wrap;
        }
        return (uint)(s->pending == 0);
      }
      return 1;
    }
  }
  else {
    flush_pending(strm);
    if (strm->avail_out != 0) goto LAB_00688a3f;
LAB_00688bf1:
    s->last_flush = -1;
  }
  return 0;
}

Assistant:

int ZEXPORT deflate (strm, flush)
    z_streamp strm;
    int flush;
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_FINISH || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (0 == s->gzhead) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (s->gzhead->time & 0xff));
                put_byte(s, ((s->gzhead->time >> 8) & 0xff));
                put_byte(s, ((s->gzhead->time >> 16) & 0xff));
                put_byte(s, ((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != 0) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != 0) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (strm->adler & 0xff));
                put_byte(s, ((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = (*(configuration_table[s->level].func))(s, flush);

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (strm->adler & 0xff));
        put_byte(s, ((strm->adler >> 8) & 0xff));
        put_byte(s, ((strm->adler >> 16) & 0xff));
        put_byte(s, ((strm->adler >> 24) & 0xff));
        put_byte(s, (strm->total_in & 0xff));
        put_byte(s, ((strm->total_in >> 8) & 0xff));
        put_byte(s, ((strm->total_in >> 16) & 0xff));
        put_byte(s, ((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}